

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<double,long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  double __y;
  long lVar2;
  long *plVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long *key;
  ulong *key_00;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  ulong *puVar12;
  long lVar13;
  double dVar14;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar15;
  tuple<> local_c1;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  long *local_88;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_80;
  double local_78;
  size_t *local_70;
  size_t local_68;
  double local_60;
  long local_58;
  double *local_50;
  size_t local_48;
  long local_40;
  unsigned_long *local_38;
  
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    return -INFINITY;
  }
  local_c0 = 0.0;
  local_88 = Xc_ind;
  local_70 = ix_arr;
  local_68 = st;
  local_50 = Xc;
  local_48 = col_num;
  if (st <= end) {
    key = ix_arr + st;
    local_c0 = 0.0;
    do {
      local_80._M_head_impl = key;
      pVar15 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
      local_c0 = local_c0 + *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      key = key + 1;
    } while (st <= end);
  }
  plVar3 = local_88;
  if (local_c0 <= 0.0) {
    return -INFINITY;
  }
  lVar13 = Xc_indptr[local_48];
  lVar2 = Xc_indptr[local_48 + 1];
  key_00 = local_70 + local_68;
  puVar7 = local_70 + end + 1;
  uVar5 = (long)puVar7 - (long)key_00 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar6 = uVar5 >> 1;
      uVar8 = ~uVar6 + uVar5;
      uVar5 = uVar6;
      if (key_00[uVar6] < (ulong)local_88[lVar13]) {
        key_00 = key_00 + uVar6 + 1;
        uVar5 = uVar8;
      }
    } while (0 < (long)uVar5);
  }
  local_40 = lVar2 + -1;
  local_78 = (double)local_88[lVar2 + -1];
  local_38 = local_70 + end;
  plVar10 = local_88;
  local_58 = lVar2;
  if (missing_action == Fail) {
    if (lVar13 != lVar2 && key_00 != puVar7) {
      local_b0 = 0.0;
      local_b8 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      lVar11 = lVar2;
      while (uVar5 = *key_00, uVar5 <= (ulong)local_78) {
        puVar1 = (ulong *)(plVar10 + lVar13);
        uVar6 = *puVar1;
        if (uVar6 == uVar5) {
          local_80._M_head_impl = key_00;
          pVar15 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
          local_a0 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
          local_60 = local_50[lVar13];
          local_a8 = local_60 * local_60;
          local_b0 = fma(local_a0,local_60,local_b0);
          local_b8 = fma(local_a0,local_a8,local_b8);
          local_90 = fma(local_a0,local_60 * local_a8,local_90);
          local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          plVar10 = local_88;
          if ((key_00 == local_38) || (lVar13 == local_40)) break;
          puVar12 = puVar1 + 1;
          key_00 = key_00 + 1;
          uVar5 = (long)plVar3 + (lVar2 * 8 - (long)puVar12) >> 3;
          lVar11 = local_58;
          if (0 < (long)uVar5) {
            do {
              uVar6 = uVar5 >> 1;
              uVar8 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if (puVar12[uVar6] < *key_00) {
                puVar12 = puVar12 + uVar6 + 1;
                uVar5 = uVar8;
              }
            } while (0 < (long)uVar5);
          }
LAB_0012da4c:
          lVar13 = (long)puVar12 - (long)plVar10 >> 3;
        }
        else {
          if ((long)uVar6 <= (long)uVar5) {
            puVar12 = puVar1 + 1;
            uVar6 = (long)plVar3 + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
            while (0 < (long)uVar6) {
              uVar8 = uVar6 >> 1;
              uVar9 = ~uVar8 + uVar6;
              uVar6 = uVar8;
              if (puVar12[uVar8] < uVar5) {
                puVar12 = puVar12 + uVar8 + 1;
                uVar6 = uVar9;
              }
            }
            goto LAB_0012da4c;
          }
          key_00 = key_00 + 1;
          uVar5 = (long)puVar7 - (long)key_00 >> 3;
          while (0 < (long)uVar5) {
            uVar8 = uVar5 >> 1;
            uVar9 = ~uVar8 + uVar5;
            uVar5 = uVar8;
            if (key_00[uVar8] < uVar6) {
              key_00 = key_00 + uVar8 + 1;
              uVar5 = uVar9;
            }
          }
        }
        if ((key_00 == puVar7) || (lVar13 == lVar11)) break;
      }
    }
    else {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
    }
  }
  else {
    if (lVar13 != lVar2 && key_00 != puVar7) {
      local_b0 = 0.0;
      local_b8 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      lVar11 = lVar2;
      while (uVar5 = *key_00, uVar5 <= (ulong)local_78) {
        puVar1 = (ulong *)(plVar10 + lVar13);
        uVar6 = *puVar1;
        if (uVar6 == uVar5) {
          local_80._M_head_impl = key_00;
          pVar15 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
          dVar14 = *(double *)((pVar15.first.m_bucket.m_bucket)->m_value + 8);
          __y = local_50[lVar13];
          if ((ulong)ABS(__y) < 0x7ff0000000000000) {
            local_a8 = __y * __y;
            local_a0 = dVar14;
            local_60 = __y;
            local_b0 = fma(dVar14,__y,local_b0);
            local_b8 = fma(local_a0,local_a8,local_b8);
            local_90 = fma(local_a0,local_60 * local_a8,local_90);
            local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          }
          else {
            local_c0 = local_c0 - dVar14;
          }
          plVar10 = local_88;
          if ((key_00 == local_38) || (lVar13 == local_40)) break;
          puVar12 = puVar1 + 1;
          key_00 = key_00 + 1;
          uVar5 = (long)plVar3 + (lVar2 * 8 - (long)puVar12) >> 3;
          lVar11 = local_58;
          if (0 < (long)uVar5) {
            do {
              uVar6 = uVar5 >> 1;
              uVar8 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if (puVar12[uVar6] < *key_00) {
                puVar12 = puVar12 + uVar6 + 1;
                uVar5 = uVar8;
              }
            } while (0 < (long)uVar5);
          }
LAB_0012d7dd:
          lVar13 = (long)puVar12 - (long)plVar10 >> 3;
        }
        else {
          if ((long)uVar6 <= (long)uVar5) {
            puVar12 = puVar1 + 1;
            uVar6 = (long)plVar3 + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
            while (0 < (long)uVar6) {
              uVar8 = uVar6 >> 1;
              uVar9 = ~uVar8 + uVar6;
              uVar6 = uVar8;
              if (puVar12[uVar8] < uVar5) {
                puVar12 = puVar12 + uVar8 + 1;
                uVar6 = uVar9;
              }
            }
            goto LAB_0012d7dd;
          }
          key_00 = key_00 + 1;
          uVar5 = (long)puVar7 - (long)key_00 >> 3;
          while (0 < (long)uVar5) {
            uVar8 = uVar5 >> 1;
            uVar9 = ~uVar8 + uVar5;
            uVar5 = uVar8;
            if (key_00[uVar8] < uVar6) {
              key_00 = key_00 + uVar8 + 1;
              uVar5 = uVar9;
            }
          }
        }
        if ((key_00 == puVar7) || (lVar13 == lVar11)) break;
      }
    }
    else {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
    }
    if (local_c0 <= 0.0) {
      return -INFINITY;
    }
  }
  if ((1.0 < local_c0) && ((local_b8 != 0.0 || (NAN(local_b8))))) {
    if ((local_b8 != local_b0 * local_b0) || (NAN(local_b8) || NAN(local_b0 * local_b0))) {
      local_78 = local_b0 / local_c0;
      local_a0 = local_78 * local_78;
      local_a8 = local_b8 / local_c0 - local_a0;
      if ((!NAN(local_a8)) &&
         ((2.220446049250313e-16 < local_a8 ||
          (bVar4 = check_more_than_two_unique_values<double,long>
                             (local_70,local_68,end,local_48,Xc_indptr,plVar10,local_50,
                              missing_action), bVar4)))) {
        if (local_a8 <= 0.0) {
          return 0.0;
        }
        dVar14 = (local_a0 * local_78 * local_78 * local_c0 +
                 local_b0 * -4.0 * local_a0 * local_78 +
                 local_b8 * 6.0 * local_a0 + local_90 * -4.0 * local_78 + local_98) /
                 (local_a8 * local_a8 * local_c0);
        if ((long)ABS(dVar14) < 0x7ff0000000000000) {
          if (dVar14 <= 0.0) {
            return 0.0;
          }
          return dVar14;
        }
        return -INFINITY;
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}